

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

void __thiscall
tcu::ScopedLogSection::ScopedLogSection
          (ScopedLogSection *this,TestLog *log,string *name,string *description)

{
  void *__buf;
  LogSection local_50;
  
  this->m_log = log;
  LogSection::LogSection(&local_50,name,description);
  LogSection::write(&local_50,(int)log,__buf,(size_t)description);
  LogSection::~LogSection(&local_50);
  return;
}

Assistant:

ScopedLogSection (TestLog& log, const std::string& name, const std::string& description)
		: m_log(log)
	{
		m_log << TestLog::Section(name, description);
	}